

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.h
# Opt level: O2

void __thiscall merlin::lbp::set_properties(lbp *this,string *opt)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  Schedule local_84;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  asgn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  string local_50 [32];
  
  if (opt->_M_string_length == 0) {
    std::__cxx11::string::string
              (local_50,"Schedule=Priority,Distance=HPM,StopIter=10,StopObj=-1,StopMsg=-1,Debug=0",
               (allocator *)&strs);
    (*(this->super_algorithm)._vptr_algorithm[0xe])(this,local_50);
    std::__cxx11::string::~string(local_50);
  }
  else {
    this->m_debug = false;
    split(&strs,opt,',');
    lVar3 = 0;
    for (uVar2 = 0;
        uVar2 < (ulong)((long)strs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)strs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      split(&asgn,(string *)
                  ((long)&((strs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
            '=');
      Property::Property((Property *)&local_84,
                         ((asgn.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      switch(local_84.t_) {
      case Fixed:
        Schedule::Schedule(&local_84,
                           asgn.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        (this->m_sched).t_ = local_84.t_;
        break;
      case Random:
        factor::Distance::Distance
                  ((Distance *)&local_84,
                   asgn.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        (this->m_dist).t_ = local_84.t_;
        break;
      case Flood:
        dVar4 = strtod(asgn.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,(char **)0x0);
        (this->super_algorithm).m_stop_iter = dVar4;
        break;
      case Priority:
        dVar4 = strtod(asgn.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,(char **)0x0);
        (this->super_algorithm).m_stop_obj = dVar4;
        break;
      case 4:
        dVar4 = strtod(asgn.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,(char **)0x0);
        (this->super_algorithm).m_stop_msg = dVar4;
        break;
      case 5:
        lVar1 = atol(asgn.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        this->m_debug = lVar1 != 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&asgn);
      lVar3 = lVar3 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&strs);
  }
  return;
}

Assistant:

virtual void set_properties(std::string opt = std::string()) {
		if (opt.length() == 0) {
			set_properties(
					"Schedule=Priority,Distance=HPM,StopIter=10,StopObj=-1,StopMsg=-1,Debug=0");
			return;
		}
		m_debug = false;
		std::vector<std::string> strs = split(opt, ',');
		for (size_t i = 0; i < strs.size(); ++i) {
			std::vector<std::string> asgn = split(strs[i], '=');
			switch (Property(asgn[0].c_str())) {
			case Property::Schedule:
				m_sched = Schedule(asgn[1].c_str());
				break;
			case Property::Distance:
				m_dist = factor::Distance(asgn[1].c_str());
				break;
			case Property::StopIter:
				set_stop_iter(strtod(asgn[1].c_str(), NULL));
				break;
			case Property::StopObj:
				set_stop_obj(strtod(asgn[1].c_str(), NULL));
				break;
			case Property::StopMsg:
				set_stop_msg(strtod(asgn[1].c_str(), NULL));
				break;
			case Property::Debug:
				m_debug = (atol(asgn[1].c_str()) == 0) ? false : true;
				break;
			default:
				break;
			}
		}
	}